

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  ImVec2 IVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ImPlotContext *gp;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar8 = GImPlot;
  pIVar6 = GImPlot->CurrentPlot;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar11 = getter->Count;
    local_48 = iVar11 + -1;
    lVar10 = (long)((getter->Offset % iVar11 + iVar11) % iVar11) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar10);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar10);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar7 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                  pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar11 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar4 = pIVar6->YAxis[iVar11].Range.Min;
    IVar5 = pIVar8->PixelRange[iVar11].Min;
    local_3c.y = (float)(pIVar8->My[iVar11] *
                         (((double)(float)(dVar7 / pIVar8->LogDenY[iVar11]) *
                           (pIVar6->YAxis[iVar11].Range.Max - dVar4) + dVar4) - dVar4) +
                        (double)IVar5.y);
    local_3c.x = (float)(pIVar8->Mx *
                         ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&pIVar6->PlotRect);
  }
  else {
    iVar11 = getter->Count;
    lVar10 = (long)((getter->Offset % iVar11 + iVar11) % iVar11) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar10);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar10);
    auVar15._8_4_ = (int)(uVar3 >> 0x20);
    auVar15._0_8_ = uVar3;
    auVar15._12_4_ = 0x45300000;
    dVar7 = log10(((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                  pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar11 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar4 = pIVar6->YAxis[iVar11].Range.Min;
    IVar5 = pIVar8->PixelRange[iVar11].Min;
    local_58._4_4_ =
         (float)(pIVar8->My[iVar11] *
                 (((double)(float)(dVar7 / pIVar8->LogDenY[iVar11]) *
                   (pIVar6->YAxis[iVar11].Range.Max - dVar4) + dVar4) - dVar4) + (double)IVar5.y);
    local_58._0_4_ =
         (float)(pIVar8->Mx *
                 ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                 (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    iVar11 = getter->Count;
    if (1 < iVar11) {
      iVar12 = 1;
      do {
        pIVar9 = GImPlot;
        lVar10 = (long)(((getter->Offset + iVar12) % iVar11 + iVar11) % iVar11) *
                 (long)getter->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar10);
        uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar10);
        auVar16._8_4_ = (int)(uVar3 >> 0x20);
        auVar16._0_8_ = uVar3;
        auVar16._12_4_ = 0x45300000;
        dVar7 = log10(((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        iVar11 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar4 = pIVar6->YAxis[iVar11].Range.Min;
        IVar5 = pIVar9->PixelRange[iVar11].Min;
        fVar13 = (float)(pIVar9->Mx *
                         ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
        fVar14 = (float)(pIVar9->My[iVar11] *
                         (((double)(float)(dVar7 / pIVar9->LogDenY[iVar11]) *
                           (pIVar6->YAxis[iVar11].Range.Max - dVar4) + dVar4) - dVar4) +
                        (double)IVar5.y);
        local_60.y = fVar14;
        local_60.x = fVar13;
        pIVar6 = pIVar8->CurrentPlot;
        fVar17 = (float)local_58._4_4_;
        if (fVar14 <= (float)local_58._4_4_) {
          fVar17 = fVar14;
        }
        if ((fVar17 < (pIVar6->PlotRect).Max.y) &&
           (fVar17 = (float)(~-(uint)(fVar14 <= (float)local_58._4_4_) & (uint)fVar14 |
                            local_58._4_4_ & -(uint)(fVar14 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) {
          fVar17 = (float)local_58._0_4_;
          if (fVar13 <= (float)local_58._0_4_) {
            fVar17 = fVar13;
          }
          if ((fVar17 < (pIVar6->PlotRect).Max.x) &&
             (fVar17 = (float)(-(uint)(fVar13 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar13 <= (float)local_58._0_4_) & (uint)fVar13),
             (pIVar6->PlotRect).Min.x <= fVar17 && fVar17 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
        iVar11 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar12 < iVar11);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}